

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

GLfloat __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::getMinPrecision
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,
          ColorChannelSelector channel)

{
  double dVar1;
  TextureInternalFormatDescriptor descriptor_00;
  TextureInternalFormatDescriptor descriptor_01;
  TextureInternalFormatDescriptor descriptor_02;
  bool bVar2;
  undefined4 *puVar3;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  uint local_24;
  GLenum local_20;
  GLuint size;
  GLenum type;
  ColorChannelSelector channel_local;
  FunctionalTest *this_local;
  
  local_20 = 0;
  local_24 = 0;
  size = channel;
  _type = this;
  switch(channel) {
  case RED_COMPONENT:
    local_20 = descriptor.expected_red_type;
    local_24 = descriptor.min_red_size;
    break;
  case GREEN_COMPONENT:
    local_20 = descriptor.expected_green_type;
    local_24 = descriptor.min_green_size;
    break;
  case BLUE_COMPONENT:
    local_20 = descriptor.expected_blue_type;
    local_24 = descriptor.min_blue_size;
    break;
  case ALPHA_COMPONENT:
    local_20 = descriptor.expected_alpha_type;
    local_24 = descriptor.min_alpha_size;
    break;
  default:
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  if ((local_20 == 0) || (local_24 == 0)) {
    this_local._4_4_ = 0.1;
  }
  else {
    memcpy(&local_68,&descriptor,0x40);
    descriptor_00.internal_format_name = (GLchar *)uStack_60;
    descriptor_00.required_by_context.super_ApiType.m_bits = (ApiType)(ApiType)(undefined4)local_68;
    descriptor_00.internal_format = local_68._4_4_;
    descriptor_00.is_sRGB = (bool)(undefined1)local_58;
    descriptor_00.is_color_renderable = (bool)local_58._1_1_;
    descriptor_00._18_2_ = local_58._2_2_;
    descriptor_00.min_red_size = local_58._4_4_;
    descriptor_00.min_green_size = (undefined4)uStack_50;
    descriptor_00.min_blue_size = uStack_50._4_4_;
    descriptor_00.min_alpha_size = (undefined4)local_48;
    descriptor_00.min_depth_size = local_48._4_4_;
    descriptor_00.min_stencil_size = (undefined4)uStack_40;
    descriptor_00.expected_red_type = uStack_40._4_4_;
    descriptor_00.expected_green_type = (undefined4)local_38;
    descriptor_00.expected_blue_type = local_38._4_4_;
    descriptor_00.expected_alpha_type = (undefined4)uStack_30;
    descriptor_00.expected_depth_type = uStack_30._4_4_;
    bVar2 = isFloatType(this,descriptor_00);
    if (bVar2) {
      switch(local_24) {
      case 10:
        this_local._4_4_ = 0.03125;
        break;
      case 0xb:
        this_local._4_4_ = 0.015625;
        break;
      default:
        this_local._4_4_ = 1e-05;
        break;
      case 0x10:
        this_local._4_4_ = 0.0009765625;
        break;
      case 0x20:
        this_local._4_4_ = 1e-05;
      }
    }
    else {
      memcpy(&local_a8,&descriptor,0x40);
      descriptor_01.internal_format_name = (GLchar *)uStack_a0;
      descriptor_01.required_by_context.super_ApiType.m_bits =
           (ApiType)(ApiType)(undefined4)local_a8;
      descriptor_01.internal_format = local_a8._4_4_;
      descriptor_01.is_sRGB = (bool)(undefined1)local_98;
      descriptor_01.is_color_renderable = (bool)local_98._1_1_;
      descriptor_01._18_2_ = local_98._2_2_;
      descriptor_01.min_red_size = local_98._4_4_;
      descriptor_01.min_green_size = (undefined4)uStack_90;
      descriptor_01.min_blue_size = uStack_90._4_4_;
      descriptor_01.min_alpha_size = (undefined4)local_88;
      descriptor_01.min_depth_size = local_88._4_4_;
      descriptor_01.min_stencil_size = (undefined4)uStack_80;
      descriptor_01.expected_red_type = uStack_80._4_4_;
      descriptor_01.expected_green_type = (undefined4)local_78;
      descriptor_01.expected_blue_type = local_78._4_4_;
      descriptor_01.expected_alpha_type = (undefined4)uStack_70;
      descriptor_01.expected_depth_type = uStack_70._4_4_;
      bVar2 = isFixedSignedType(this,descriptor_01);
      if (bVar2) {
        dVar1 = pow(2.0,(double)(local_24 - 1));
        this_local._4_4_ = (float)(1.0 / dVar1);
      }
      else {
        memcpy(&local_e8,&descriptor,0x40);
        descriptor_02.internal_format_name = (GLchar *)uStack_e0;
        descriptor_02.required_by_context.super_ApiType.m_bits =
             (ApiType)(ApiType)(undefined4)local_e8;
        descriptor_02.internal_format = local_e8._4_4_;
        descriptor_02.is_sRGB = (bool)(undefined1)local_d8;
        descriptor_02.is_color_renderable = (bool)local_d8._1_1_;
        descriptor_02._18_2_ = local_d8._2_2_;
        descriptor_02.min_red_size = local_d8._4_4_;
        descriptor_02.min_green_size = (undefined4)uStack_d0;
        descriptor_02.min_blue_size = uStack_d0._4_4_;
        descriptor_02.min_alpha_size = (undefined4)local_c8;
        descriptor_02.min_depth_size = local_c8._4_4_;
        descriptor_02.min_stencil_size = (undefined4)uStack_c0;
        descriptor_02.expected_red_type = uStack_c0._4_4_;
        descriptor_02.expected_green_type = (undefined4)local_b8;
        descriptor_02.expected_blue_type = local_b8._4_4_;
        descriptor_02.expected_alpha_type = (undefined4)uStack_b0;
        descriptor_02.expected_depth_type = uStack_b0._4_4_;
        bVar2 = isFixedUnsignedType(this,descriptor_02);
        if (bVar2) {
          dVar1 = pow(2.0,(double)local_24);
          this_local._4_4_ = (float)(1.0 / dVar1);
        }
        else {
          this_local._4_4_ = 1.0;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

glw::GLfloat FunctionalTest::getMinPrecision(TextureInternalFormatDescriptor descriptor, ColorChannelSelector channel)
{
	/* Select channel data. */
	glw::GLenum type = GL_NONE;
	glw::GLuint size = 0;

	switch (channel)
	{
	case RED_COMPONENT:
		type = descriptor.expected_red_type;
		size = descriptor.min_red_size;
		break;
	case GREEN_COMPONENT:
		type = descriptor.expected_green_type;
		size = descriptor.min_green_size;
		break;
	case BLUE_COMPONENT:
		type = descriptor.expected_blue_type;
		size = descriptor.min_blue_size;
		break;
	case ALPHA_COMPONENT:
		type = descriptor.expected_alpha_type;
		size = descriptor.min_alpha_size;
		break;
	default:
		throw 0;
	}

	/* If it is empty channel. */
	if ((type == GL_NONE) || (size == 0))
	{
		return 0.1f;
	}

	/* If float type. */
	if (isFloatType(descriptor))
	{
		switch (size)
		{
		case 32:
			return 0.00001f; /* specification GL4.5 core constant */
		case 16:
			return 1.f / 1024.f; /* specification GL4.5 core 10 bit mantisa constant */
		case 11:
			return 1.f / 64.f; /* specification GL4.5 core 6 bit mantisa constant */
		case 10:
			return 1.f / 32.f; /* specification GL4.5 core 5 bit mantisa constant */
		default:
			return 0.00001f;
		}
	}

	/* Fixed types precision */
	if (isFixedSignedType(descriptor))
	{
		return (float)(1.0 / pow(2.0, (double)(size - 1 /* sign bit */)));
	}

	if (isFixedUnsignedType(descriptor))
	{
		return (float)(1.0 / pow(2.0, (double)(size)));
	}

	/* other aka (unsigned) integer */
	return 1;
}